

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_c05c57::HandleSortCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value_00;
  pointer pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  cmExecutionStatus *pcVar4;
  bool bVar5;
  size_type sVar6;
  cmMakefile *pcVar7;
  iterator iVar8;
  iterator __last;
  string_view local_6a8;
  string_view local_698;
  undefined1 local_688 [8];
  string value;
  undefined1 local_620 [8];
  cmStringSorter sorter;
  undefined1 local_5d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string *listName;
  cmAlphaNum local_588;
  string local_558;
  cmAlphaNum local_538;
  cmAlphaNum local_508;
  string local_4d8;
  cmAlphaNum local_4b8;
  cmAlphaNum local_488;
  string local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_438;
  string *argument_2;
  cmAlphaNum local_400;
  string local_3d0;
  cmAlphaNum local_3b0;
  cmAlphaNum local_380;
  string local_350;
  cmAlphaNum local_330;
  cmAlphaNum local_300;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  string *argument_1;
  cmAlphaNum local_278;
  string local_248;
  cmAlphaNum local_228;
  cmAlphaNum local_1f8;
  string local_1c8;
  cmAlphaNum local_1a8;
  cmAlphaNum local_178;
  undefined1 local_148 [8];
  string error_1;
  string *argument;
  cmAlphaNum local_118;
  cmAlphaNum local_e8;
  undefined1 local_b8 [8];
  string error;
  string *option;
  undefined1 local_88 [8];
  string messageHint;
  size_t argumentIndex;
  Order sortOrder;
  CaseSensitivity sortCaseSensitivity;
  Compare sortCompare;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar6 < 2) {
    __assert_fail("args.size() >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx"
                  ,0x4a4,
                  "bool (anonymous namespace)::HandleSortCommand(const std::vector<std::string> &, cmExecutionStatus &)"
                 );
  }
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local);
  pcVar4 = local_20;
  if (sVar6 < 9) {
    sortOrder = UNINITIALIZED;
    argumentIndex._4_4_ = UNINITIALIZED;
    argumentIndex._0_4_ = UNINITIALIZED;
    messageHint.field_2._8_8_ = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"sub-command SORT ",(allocator<char> *)((long)&option + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&option + 7));
    while (uVar2 = messageHint.field_2._8_8_,
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local), uVar3 = messageHint.field_2._8_8_, (ulong)uVar2 < sVar6)
    {
      messageHint.field_2._8_8_ = messageHint.field_2._8_8_ + 1;
      error.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,uVar3);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              error.field_2._8_8_,"COMPARE");
      uVar2 = messageHint.field_2._8_8_;
      if (bVar5) {
        if (sortOrder != UNINITIALIZED) {
          cmAlphaNum::cmAlphaNum(&local_e8,(string *)local_88);
          cmAlphaNum::cmAlphaNum(&local_118,"option \"");
          cmStrCat<std::__cxx11::string,char[37]>
                    ((string *)local_b8,&local_e8,&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     error.field_2._8_8_,(char (*) [37])"\" has been specified multiple times.");
          cmExecutionStatus::SetError(local_20,(string *)local_b8);
          args_local._7_1_ = 0;
          std::__cxx11::string::~string((string *)local_b8);
          goto LAB_00630d39;
        }
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
        pcVar4 = local_20;
        uVar3 = messageHint.field_2._8_8_;
        if (sVar6 <= (ulong)uVar2) {
          cmAlphaNum::cmAlphaNum(&local_1f8,(string *)local_88);
          cmAlphaNum::cmAlphaNum(&local_228,"missing argument for option \"");
          cmStrCat<std::__cxx11::string,char[3]>
                    (&local_1c8,&local_1f8,&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     error.field_2._8_8_,(char (*) [3])0xd299d5);
          cmExecutionStatus::SetError(pcVar4,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          args_local._7_1_ = 0;
          goto LAB_00630d39;
        }
        messageHint.field_2._8_8_ = messageHint.field_2._8_8_ + 1;
        error_1.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,uVar3);
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )error_1.field_2._8_8_,"STRING");
        if (bVar5) {
          sortOrder = ASCENDING;
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)error_1.field_2._8_8_,"FILE_BASENAME");
          if (bVar5) {
            sortOrder = DESCENDING;
          }
          else {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)error_1.field_2._8_8_,"NATURAL");
            if (!bVar5) {
              cmAlphaNum::cmAlphaNum(&local_178,(string *)local_88);
              cmAlphaNum::cmAlphaNum(&local_1a8,"value \"");
              cmStrCat<std::__cxx11::string,char[15],std::__cxx11::string,char[14]>
                        ((string *)local_148,&local_178,&local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         error_1.field_2._8_8_,(char (*) [15])"\" for option \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         error.field_2._8_8_,(char (*) [14])"\" is invalid.");
              cmExecutionStatus::SetError(local_20,(string *)local_148);
              args_local._7_1_ = 0;
              std::__cxx11::string::~string((string *)local_148);
              goto LAB_00630d39;
            }
            sortOrder = DESCENDING|ASCENDING;
          }
        }
      }
      else {
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )error.field_2._8_8_,"CASE");
        pcVar4 = local_20;
        uVar2 = messageHint.field_2._8_8_;
        if (bVar5) {
          if (argumentIndex._4_4_ != UNINITIALIZED) {
            cmAlphaNum::cmAlphaNum(&local_278,(string *)local_88);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&argument_1,"option \"");
            cmStrCat<std::__cxx11::string,char[37]>
                      (&local_248,&local_278,(cmAlphaNum *)&argument_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       error.field_2._8_8_,(char (*) [37])"\" has been specified multiple times.");
            cmExecutionStatus::SetError(pcVar4,&local_248);
            std::__cxx11::string::~string((string *)&local_248);
            args_local._7_1_ = 0;
            goto LAB_00630d39;
          }
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
          pcVar4 = local_20;
          uVar3 = messageHint.field_2._8_8_;
          if (sVar6 <= (ulong)uVar2) {
            cmAlphaNum::cmAlphaNum(&local_380,(string *)local_88);
            cmAlphaNum::cmAlphaNum(&local_3b0,"missing argument for option \"");
            cmStrCat<std::__cxx11::string,char[3]>
                      (&local_350,&local_380,&local_3b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       error.field_2._8_8_,(char (*) [3])0xd299d5);
            cmExecutionStatus::SetError(pcVar4,&local_350);
            std::__cxx11::string::~string((string *)&local_350);
            args_local._7_1_ = 0;
            goto LAB_00630d39;
          }
          messageHint.field_2._8_8_ = messageHint.field_2._8_8_ + 1;
          local_2b0 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)status_local,uVar3);
          bVar5 = std::operator==(local_2b0,"SENSITIVE");
          if (bVar5) {
            argumentIndex._4_4_ = SENSITIVE;
          }
          else {
            bVar5 = std::operator==(local_2b0,"INSENSITIVE");
            pcVar4 = local_20;
            if (!bVar5) {
              cmAlphaNum::cmAlphaNum(&local_300,(string *)local_88);
              cmAlphaNum::cmAlphaNum(&local_330,"value \"");
              cmStrCat<std::__cxx11::string,char[15],std::__cxx11::string,char[14]>
                        (&local_2d0,&local_300,&local_330,local_2b0,
                         (char (*) [15])"\" for option \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         error.field_2._8_8_,(char (*) [14])"\" is invalid.");
              cmExecutionStatus::SetError(pcVar4,&local_2d0);
              std::__cxx11::string::~string((string *)&local_2d0);
              args_local._7_1_ = 0;
              goto LAB_00630d39;
            }
            argumentIndex._4_4_ = INSENSITIVE;
          }
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)error.field_2._8_8_,"ORDER");
          pcVar4 = local_20;
          uVar2 = messageHint.field_2._8_8_;
          if (!bVar5) {
            cmAlphaNum::cmAlphaNum(&local_588,(string *)local_88);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&listName,"option \"");
            cmStrCat<std::__cxx11::string,char[14]>
                      (&local_558,&local_588,(cmAlphaNum *)&listName,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       error.field_2._8_8_,(char (*) [14])"\" is unknown.");
            cmExecutionStatus::SetError(pcVar4,&local_558);
            std::__cxx11::string::~string((string *)&local_558);
            args_local._7_1_ = 0;
            goto LAB_00630d39;
          }
          if ((Order)argumentIndex != UNINITIALIZED) {
            cmAlphaNum::cmAlphaNum(&local_400,(string *)local_88);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&argument_2,"option \"");
            cmStrCat<std::__cxx11::string,char[37]>
                      (&local_3d0,&local_400,(cmAlphaNum *)&argument_2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       error.field_2._8_8_,(char (*) [37])"\" has been specified multiple times.");
            cmExecutionStatus::SetError(pcVar4,&local_3d0);
            std::__cxx11::string::~string((string *)&local_3d0);
            args_local._7_1_ = 0;
            goto LAB_00630d39;
          }
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
          pcVar4 = local_20;
          uVar3 = messageHint.field_2._8_8_;
          if (sVar6 <= (ulong)uVar2) {
            cmAlphaNum::cmAlphaNum(&local_508,(string *)local_88);
            cmAlphaNum::cmAlphaNum(&local_538,"missing argument for option \"");
            cmStrCat<std::__cxx11::string,char[3]>
                      (&local_4d8,&local_508,&local_538,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       error.field_2._8_8_,(char (*) [3])0xd299d5);
            cmExecutionStatus::SetError(pcVar4,&local_4d8);
            std::__cxx11::string::~string((string *)&local_4d8);
            args_local._7_1_ = 0;
            goto LAB_00630d39;
          }
          messageHint.field_2._8_8_ = messageHint.field_2._8_8_ + 1;
          local_438 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)status_local,uVar3);
          bVar5 = std::operator==(local_438,"ASCENDING");
          if (bVar5) {
            argumentIndex._0_4_ = ASCENDING;
          }
          else {
            bVar5 = std::operator==(local_438,"DESCENDING");
            pcVar4 = local_20;
            if (!bVar5) {
              cmAlphaNum::cmAlphaNum(&local_488,(string *)local_88);
              cmAlphaNum::cmAlphaNum(&local_4b8,"value \"");
              cmStrCat<std::__cxx11::string,char[15],std::__cxx11::string,char[14]>
                        (&local_458,&local_488,&local_4b8,local_438,
                         (char (*) [15])"\" for option \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         error.field_2._8_8_,(char (*) [14])"\" is invalid.");
              cmExecutionStatus::SetError(pcVar4,&local_458);
              std::__cxx11::string::~string((string *)&local_458);
              args_local._7_1_ = 0;
              goto LAB_00630d39;
            }
            argumentIndex._0_4_ = DESCENDING;
          }
        }
      }
    }
    if (sortOrder == UNINITIALIZED) {
      sortOrder = ASCENDING;
    }
    if (argumentIndex._4_4_ == UNINITIALIZED) {
      argumentIndex._4_4_ = SENSITIVE;
    }
    if ((Order)argumentIndex == UNINITIALIZED) {
      argumentIndex._0_4_ = ASCENDING;
    }
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_5d8);
    pbVar1 = varArgsExpanded.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar7 = cmExecutionStatus::GetMakefile(local_20);
    bVar5 = GetList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_5d8,pbVar1,pcVar7);
    if (bVar5) {
      if (((sortOrder == ASCENDING) && (argumentIndex._4_4_ == SENSITIVE)) &&
         ((Order)argumentIndex == ASCENDING)) {
        iVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_5d8);
        sorter._48_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_5d8);
        std::
        sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )iVar8._M_current,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )sorter._48_8_);
      }
      else {
        cmStringSorter::cmStringSorter
                  ((cmStringSorter *)local_620,sortOrder,argumentIndex._4_4_,(Order)argumentIndex);
        iVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_5d8);
        __last = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_5d8);
        cmStringSorter::cmStringSorter
                  ((cmStringSorter *)((long)&value.field_2 + 8),(cmStringSorter *)local_620);
        std::
        sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(anonymous_namespace)::cmStringSorter>
                  ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )iVar8._M_current,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__last._M_current,(cmStringSorter *)((long)&value.field_2 + 8));
        cmStringSorter::~cmStringSorter((cmStringSorter *)((long)&value.field_2 + 8));
        cmStringSorter::~cmStringSorter((cmStringSorter *)local_620);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_698,";");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6a8);
      cmJoin((string *)local_688,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_5d8,local_698,local_6a8);
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      pbVar1 = varArgsExpanded.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      value_00 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_688);
      cmMakefile::AddDefinition(pcVar7,pbVar1,value_00);
      args_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_688);
    }
    else {
      args_local._7_1_ = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_5d8);
LAB_00630d39:
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command SORT only takes up to six arguments.",&local_41);
    cmExecutionStatus::SetError(pcVar4,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleSortCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  assert(args.size() >= 2);
  if (args.size() > 8) {
    status.SetError("sub-command SORT only takes up to six arguments.");
    return false;
  }

  auto sortCompare = cmStringSorter::Compare::UNINITIALIZED;
  auto sortCaseSensitivity = cmStringSorter::CaseSensitivity::UNINITIALIZED;
  auto sortOrder = cmStringSorter::Order::UNINITIALIZED;

  size_t argumentIndex = 2;
  const std::string messageHint = "sub-command SORT ";

  while (argumentIndex < args.size()) {
    std::string const& option = args[argumentIndex++];
    if (option == "COMPARE") {
      if (sortCompare != cmStringSorter::Compare::UNINITIALIZED) {
        std::string error = cmStrCat(messageHint, "option \"", option,
                                     "\" has been specified multiple times.");
        status.SetError(error);
        return false;
      }
      if (argumentIndex < args.size()) {
        std::string const& argument = args[argumentIndex++];
        if (argument == "STRING") {
          sortCompare = cmStringSorter::Compare::STRING;
        } else if (argument == "FILE_BASENAME") {
          sortCompare = cmStringSorter::Compare::FILE_BASENAME;
        } else if (argument == "NATURAL") {
          sortCompare = cmStringSorter::Compare::NATURAL;
        } else {
          std::string error =
            cmStrCat(messageHint, "value \"", argument, "\" for option \"",
                     option, "\" is invalid.");
          status.SetError(error);
          return false;
        }
      } else {
        status.SetError(cmStrCat(messageHint, "missing argument for option \"",
                                 option, "\"."));
        return false;
      }
    } else if (option == "CASE") {
      if (sortCaseSensitivity !=
          cmStringSorter::CaseSensitivity::UNINITIALIZED) {
        status.SetError(cmStrCat(messageHint, "option \"", option,
                                 "\" has been specified multiple times."));
        return false;
      }
      if (argumentIndex < args.size()) {
        std::string const& argument = args[argumentIndex++];
        if (argument == "SENSITIVE") {
          sortCaseSensitivity = cmStringSorter::CaseSensitivity::SENSITIVE;
        } else if (argument == "INSENSITIVE") {
          sortCaseSensitivity = cmStringSorter::CaseSensitivity::INSENSITIVE;
        } else {
          status.SetError(cmStrCat(messageHint, "value \"", argument,
                                   "\" for option \"", option,
                                   "\" is invalid."));
          return false;
        }
      } else {
        status.SetError(cmStrCat(messageHint, "missing argument for option \"",
                                 option, "\"."));
        return false;
      }
    } else if (option == "ORDER") {

      if (sortOrder != cmStringSorter::Order::UNINITIALIZED) {
        status.SetError(cmStrCat(messageHint, "option \"", option,
                                 "\" has been specified multiple times."));
        return false;
      }
      if (argumentIndex < args.size()) {
        std::string const& argument = args[argumentIndex++];
        if (argument == "ASCENDING") {
          sortOrder = cmStringSorter::Order::ASCENDING;
        } else if (argument == "DESCENDING") {
          sortOrder = cmStringSorter::Order::DESCENDING;
        } else {
          status.SetError(cmStrCat(messageHint, "value \"", argument,
                                   "\" for option \"", option,
                                   "\" is invalid."));
          return false;
        }
      } else {
        status.SetError(cmStrCat(messageHint, "missing argument for option \"",
                                 option, "\"."));
        return false;
      }
    } else {
      status.SetError(
        cmStrCat(messageHint, "option \"", option, "\" is unknown."));
      return false;
    }
  }
  // set Default Values if Option is not given
  if (sortCompare == cmStringSorter::Compare::UNINITIALIZED) {
    sortCompare = cmStringSorter::Compare::STRING;
  }
  if (sortCaseSensitivity == cmStringSorter::CaseSensitivity::UNINITIALIZED) {
    sortCaseSensitivity = cmStringSorter::CaseSensitivity::SENSITIVE;
  }
  if (sortOrder == cmStringSorter::Order::UNINITIALIZED) {
    sortOrder = cmStringSorter::Order::ASCENDING;
  }

  const std::string& listName = args[1];
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, listName, status.GetMakefile())) {
    return true;
  }

  if ((sortCompare == cmStringSorter::Compare::STRING) &&
      (sortCaseSensitivity == cmStringSorter::CaseSensitivity::SENSITIVE) &&
      (sortOrder == cmStringSorter::Order::ASCENDING)) {
    std::sort(varArgsExpanded.begin(), varArgsExpanded.end());
  } else {
    cmStringSorter sorter(sortCompare, sortCaseSensitivity, sortOrder);
    std::sort(varArgsExpanded.begin(), varArgsExpanded.end(), sorter);
  }

  std::string value = cmJoin(varArgsExpanded, ";");
  status.GetMakefile().AddDefinition(listName, value);
  return true;
}